

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tiff_io.cc
# Opt level: O0

void __thiscall gimage::TIFFImageIO::save(TIFFImageIO *this,ImageU8 *image,char *name)

{
  char *in_stack_000001e8;
  Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_> *in_stack_000001f0;
  
  anon_unknown_6::saveInternal<unsigned_char>(in_stack_000001f0,in_stack_000001e8);
  return;
}

Assistant:

void TIFFImageIO::save(const ImageU8 &image, const char *name) const
{
  saveInternal(image, name);
}